

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O3

void NJDNode_load(NJDNode *node,char *str)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  NJDNode *node2;
  byte *__s;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  char buff [1024];
  char buff_acc [1024];
  char buff_pron [1024];
  char buff_read [1024];
  char buff_orig [1024];
  char buff_string [1024];
  int local_1844;
  int local_1840;
  int local_183c;
  short local_1838 [512];
  byte local_1438 [1024];
  byte local_1038 [1024];
  byte local_c38 [1024];
  byte local_838 [1024];
  char local_438 [1032];
  
  bVar8 = *str;
  uVar9 = (ulong)bVar8;
  uVar13 = (uint)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar13 = 1;
      uVar9 = 0;
    }
    else {
      uVar2 = 0;
      uVar12 = uVar9;
      do {
        uVar7 = uVar2;
        local_438[uVar7] = (char)uVar12;
        bVar8 = str[uVar7 + 1];
        uVar12 = (ulong)bVar8;
        uVar9 = uVar7 + 1;
        if (bVar8 == 0) {
          uVar13 = (uint)uVar9;
          goto LAB_00147657;
        }
        uVar2 = uVar9;
      } while (bVar8 != 0x2c);
      uVar13 = (int)uVar7 + 2;
    }
  }
LAB_00147657:
  local_438[uVar9 & 0xffffffff] = '\0';
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_0014769f;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_0014769f:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_pos(node,(char *)local_1838);
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_001476f1;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_001476f1:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_pos_group1(node,(char *)local_1838);
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_00147743;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_00147743:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_pos_group2(node,(char *)local_1838);
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_00147795;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_00147795:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_pos_group3(node,(char *)local_1838);
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_001477e7;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_001477e7:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_ctype(node,(char *)local_1838);
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_00147839;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_00147839:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_cform(node,(char *)local_1838);
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        local_838[uVar9] = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_0014788e;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_0014788e:
  local_838[uVar9 & 0xffffffff] = 0;
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        local_c38[uVar9] = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_001478d9;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_001478d9:
  local_c38[uVar9 & 0xffffffff] = 0;
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        local_1038[uVar9] = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_00147924;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_00147924:
  local_1038[uVar9 & 0xffffffff] = 0;
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        local_1438[uVar9] = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_0014796f;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_0014796f:
  local_1438[uVar9 & 0xffffffff] = 0;
  bVar8 = str[(int)uVar13];
  uVar9 = (ulong)bVar8;
  if (bVar8 != 0) {
    if (bVar8 == 0x2c) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        *(byte *)((long)local_1838 + uVar9) = bVar8;
        bVar8 = str[uVar9 + (long)(int)uVar13 + 1];
        uVar9 = uVar9 + 1;
        if (bVar8 == 0) {
          uVar13 = uVar13 + (int)uVar9;
          goto LAB_001479b7;
        }
      } while (bVar8 != 0x2c);
      uVar13 = uVar13 + (int)uVar9;
    }
    uVar13 = uVar13 + 1;
  }
LAB_001479b7:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  NJDNode_set_chain_rule(node,(char *)local_1838);
  cVar1 = str[(int)uVar13];
  uVar9 = 0;
  if ((cVar1 != '\0') && (cVar1 != ',')) {
    uVar9 = 0;
    do {
      *(char *)((long)local_1838 + uVar9) = cVar1;
      cVar1 = str[uVar9 + (long)(int)uVar13 + 1];
      uVar9 = uVar9 + 1;
      if (cVar1 == ',') break;
    } while (cVar1 != '\0');
    uVar9 = uVar9 & 0xffffffff;
  }
  *(undefined1 *)((long)local_1838 + uVar9) = 0;
  if (local_1838[0] == 0x31) {
    iVar4 = 1;
LAB_00147a1a:
    node->chain_flag = iVar4;
  }
  else if (local_1838[0] == 0x30) {
    iVar4 = 0;
    goto LAB_00147a1a;
  }
  pcVar5 = strchr((char *)local_1438,0x2a);
  if (pcVar5 == (char *)0x0) {
    __s = local_1438;
    pcVar5 = strchr((char *)__s,0x2f);
    if (pcVar5 != (char *)0x0) {
      iVar4 = 0;
      do {
        if (*__s == 0x2f) {
          iVar4 = iVar4 + 1;
        }
        else if (*__s == 0) goto LAB_00147ac9;
        __s = __s + 1;
      } while( true );
    }
  }
  NJDNode_set_string(node,local_438);
  NJDNode_set_orig(node,(char *)local_838);
  NJDNode_set_read(node,(char *)local_c38);
  NJDNode_set_pron(node,(char *)local_1038);
  node->acc = 0;
  goto LAB_00147a7f;
LAB_00147ac9:
  if (iVar4 != 1) {
    if (iVar4 < 1) {
      return;
    }
    local_183c = 0;
    iVar10 = 0;
    iVar14 = 0;
    iVar11 = 0;
    local_1840 = 0;
    local_1844 = 0;
    node2 = (NJDNode *)0x0;
    do {
      if (iVar10 != 0) {
        node = (NJDNode *)calloc(1,0x78);
        node->string = (char *)0x0;
        node->pos = (char *)0x0;
        node->pos_group1 = (char *)0x0;
        node->pos_group2 = (char *)0x0;
        node->pos_group3 = (char *)0x0;
        node->ctype = (char *)0x0;
        node->cform = (char *)0x0;
        node->orig = (char *)0x0;
        node->read = (char *)0x0;
        node->pron = (char *)0x0;
        node->acc = 0;
        node->mora_size = 0;
        node->chain_rule = (char *)0x0;
        node->chain_flag = -1;
        node->prev = (_NJDNode *)0x0;
        node->next = (_NJDNode *)0x0;
        NJDNode_copy(node,node2);
        node->chain_flag = 0;
        node->prev = node2;
        node2->next = node;
      }
      bVar8 = local_838[local_1844];
      uVar9 = (ulong)bVar8;
      if (bVar8 != 0) {
        if (bVar8 == 0x3a) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            *(byte *)((long)local_1838 + uVar9) = bVar8;
            bVar8 = local_838[uVar9 + (long)local_1844 + 1];
            uVar9 = uVar9 + 1;
            if (bVar8 == 0) {
              local_1844 = local_1844 + (int)uVar9;
              goto LAB_00147c19;
            }
          } while (bVar8 != 0x3a);
          local_1844 = local_1844 + (int)uVar9;
        }
        local_1844 = local_1844 + 1;
      }
LAB_00147c19:
      *(char *)((long)local_1838 + (uVar9 & 0xffffffff)) = '\0';
      NJDNode_set_orig(node,(char *)local_1838);
      iVar10 = iVar10 + 1;
      if (iVar10 < iVar4) {
        NJDNode_set_string(node,(char *)local_1838);
        sVar6 = strlen((char *)local_1838);
        local_183c = local_183c + (int)sVar6;
      }
      else {
        NJDNode_set_string(node,local_438 + local_183c);
      }
      bVar8 = local_c38[local_1840];
      uVar9 = (ulong)bVar8;
      if (bVar8 != 0) {
        if (bVar8 == 0x3a) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            *(byte *)((long)local_1838 + uVar9) = bVar8;
            bVar8 = local_c38[uVar9 + (long)local_1840 + 1];
            uVar9 = uVar9 + 1;
            if (bVar8 == 0) {
              local_1840 = local_1840 + (int)uVar9;
              goto LAB_00147caf;
            }
          } while (bVar8 != 0x3a);
          local_1840 = local_1840 + (int)uVar9;
        }
        local_1840 = local_1840 + 1;
      }
LAB_00147caf:
      *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
      NJDNode_set_read(node,(char *)local_1838);
      bVar8 = local_1038[iVar11];
      uVar9 = (ulong)bVar8;
      if (bVar8 != 0) {
        if (bVar8 == 0x3a) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            *(byte *)((long)local_1838 + uVar9) = bVar8;
            bVar8 = local_1038[uVar9 + (long)iVar11 + 1];
            uVar9 = uVar9 + 1;
            if (bVar8 == 0) {
              iVar11 = iVar11 + (int)uVar9;
              goto LAB_00147d07;
            }
          } while (bVar8 != 0x3a);
          iVar11 = iVar11 + (int)uVar9;
        }
        iVar11 = iVar11 + 1;
      }
LAB_00147d07:
      *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
      NJDNode_set_pron(node,(char *)local_1838);
      bVar8 = local_1438[iVar14];
      uVar9 = (ulong)bVar8;
      if (bVar8 != 0) {
        if (bVar8 == 0x2f) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            *(byte *)((long)local_1838 + uVar9) = bVar8;
            bVar8 = local_1438[uVar9 + (long)iVar14 + 1];
            uVar9 = uVar9 + 1;
            if (bVar8 == 0) {
              iVar14 = iVar14 + (int)uVar9;
              goto LAB_00147d5f;
            }
          } while (bVar8 != 0x2f);
          iVar14 = iVar14 + (int)uVar9;
        }
        iVar14 = iVar14 + 1;
      }
LAB_00147d5f:
      *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
      if ((char)local_1838[0] == '\0') {
        fwrite("WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n",0x38,1,_stderr);
LAB_00147e54:
        node->acc = 0;
      }
      else {
        iVar3 = atoi((char *)local_1838);
        node->acc = iVar3;
        if (iVar3 < 0) {
          NJDNode_load_cold_1();
          goto LAB_00147e54;
        }
      }
      bVar8 = local_1438[iVar14];
      uVar9 = (ulong)bVar8;
      if (bVar8 != 0) {
        if (bVar8 == 0x3a) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            *(byte *)((long)local_1838 + uVar9) = bVar8;
            bVar8 = local_1438[uVar9 + (long)iVar14 + 1];
            uVar9 = uVar9 + 1;
            if (bVar8 == 0) {
              iVar14 = iVar14 + (int)uVar9;
              goto LAB_00147dcf;
            }
          } while (bVar8 != 0x3a);
          iVar14 = iVar14 + (int)uVar9;
        }
        iVar14 = iVar14 + 1;
      }
LAB_00147dcf:
      *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
      if ((char)local_1838[0] == '\0') {
        fwrite("WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n",0x3b,1,_stderr);
LAB_00147e6a:
        node->mora_size = 0;
      }
      else {
        iVar3 = atoi((char *)local_1838);
        node->mora_size = iVar3;
        if (iVar3 < 0) {
          NJDNode_load_cold_2();
          goto LAB_00147e6a;
        }
      }
      node2 = node;
      if (iVar10 == iVar4) {
        return;
      }
    } while( true );
  }
  NJDNode_set_string(node,local_438);
  NJDNode_set_orig(node,(char *)local_838);
  NJDNode_set_read(node,(char *)local_c38);
  NJDNode_set_pron(node,(char *)local_1038);
  uVar9 = (ulong)local_1438[0];
  uVar13 = (uint)local_1438[0];
  if (local_1438[0] != 0) {
    if (local_1438[0] == 0x2f) {
      uVar13 = 1;
      uVar9 = 0;
    }
    else {
      uVar2 = 0;
      uVar12 = uVar9;
      do {
        uVar7 = uVar2;
        *(char *)((long)local_1838 + uVar7) = (char)uVar12;
        bVar8 = local_1438[uVar7 + 1];
        uVar12 = (ulong)bVar8;
        uVar9 = uVar7 + 1;
        if (bVar8 == 0) {
          uVar13 = (uint)uVar9;
          goto LAB_00147ea3;
        }
        uVar2 = uVar9;
      } while (bVar8 != 0x2f);
      uVar13 = (int)uVar7 + 2;
    }
  }
LAB_00147ea3:
  *(undefined1 *)((long)local_1838 + (uVar9 & 0xffffffff)) = 0;
  if ((char)local_1838[0] == '\0') {
    fwrite("WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n",0x38,1,_stderr);
LAB_00147f89:
    node->acc = 0;
  }
  else {
    iVar4 = atoi((char *)local_1838);
    node->acc = iVar4;
    if (iVar4 < 0) {
      NJDNode_load_cold_3();
      goto LAB_00147f89;
    }
  }
  bVar8 = local_1438[(int)uVar13];
  uVar9 = 0;
  if ((bVar8 != 0) && (bVar8 != 0x3a)) {
    uVar9 = 0;
    do {
      *(byte *)((long)local_1838 + uVar9) = bVar8;
      bVar8 = local_1438[uVar9 + (long)(int)uVar13 + 1];
      uVar9 = uVar9 + 1;
      if (bVar8 == 0x3a) break;
    } while (bVar8 != 0);
    uVar9 = uVar9 & 0xffffffff;
  }
  *(undefined1 *)((long)local_1838 + uVar9) = 0;
  if ((char)local_1838[0] == '\0') {
    fwrite("WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n",0x3b,1,_stderr);
  }
  else {
    iVar4 = atoi((char *)local_1838);
    node->mora_size = iVar4;
    if (-1 < iVar4) {
      return;
    }
    NJDNode_load_cold_4();
  }
LAB_00147a7f:
  node->mora_size = 0;
  return;
}

Assistant:

void NJDNode_load(NJDNode * node, const char *str)
{
   int i, j;
   int index = 0;
   char buff[MAXBUFLEN];
   char buff_string[MAXBUFLEN];
   char buff_orig[MAXBUFLEN];
   char buff_read[MAXBUFLEN];
   char buff_pron[MAXBUFLEN];
   char buff_acc[MAXBUFLEN];
   int count;
   int index_string;
   int index_orig;
   int index_read;
   int index_pron;
   int index_acc;
   NJDNode *prev = NULL;

   /* load */
   get_token_from_string(str, &index, buff_string, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group1(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group2(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group3(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_ctype(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_cform(node, buff);
   get_token_from_string(str, &index, buff_orig, ',');
   get_token_from_string(str, &index, buff_read, ',');
   get_token_from_string(str, &index, buff_pron, ',');
   get_token_from_string(str, &index, buff_acc, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_chain_rule(node, buff);
   get_token_from_string(str, &index, buff, ',');
   if (strcmp(buff, "1") == 0)
      NJDNode_set_chain_flag(node, 1);
   else if (strcmp(buff, "0") == 0)
      NJDNode_set_chain_flag(node, 0);

   /* for symbol */
   if (strstr(buff_acc, "*") != NULL || strstr(buff_acc, "/") == NULL) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      NJDNode_set_acc(node, 0);
      NJDNode_set_mora_size(node, 0);
      return;
   }

   /* count chained word */
   for (i = 0, count = 0; buff_acc[i] != '\0'; i++)
      if (buff_acc[i] == '/')
         count++;

   /* for single word */
   if (count == 1) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      index_acc = 0;
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      return;
   }

   /* parse chained word */
   index_string = 0;
   index_orig = 0;
   index_read = 0;
   index_pron = 0;
   index_acc = 0;
   for (i = 0; i < count; i++) {
      if (i > 0) {
         node = (NJDNode *) calloc(1, sizeof(NJDNode));
         NJDNode_initialize(node);
         NJDNode_copy(node, prev);
         NJDNode_set_chain_flag(node, 0);
         node->prev = prev;
         prev->next = node;
      }
      /* orig */
      get_token_from_string(buff_orig, &index_orig, buff, ':');
      NJDNode_set_orig(node, buff);
      /* string */
      if (i + 1 < count) {
         NJDNode_set_string(node, buff);
         index_string += strlen(buff);
      } else {
         NJDNode_set_string(node, &buff_string[index_string]);
      }
      /* read */
      get_token_from_string(buff_read, &index_read, buff, ':');
      NJDNode_set_read(node, buff);
      /* pron */
      get_token_from_string(buff_pron, &index_pron, buff, ':');
      NJDNode_set_pron(node, buff);
      /* acc */
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      /* mora size */
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      prev = node;
   }
}